

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::ShaderModule>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  DeviceInterface *vk;
  VkDevice device;
  const_iterator cVar1;
  Unique<vk::Handle<(vk::HandleType)14>_> obj;
  VkShaderModule local_78;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_70;
  deUint32 *local_58;
  Move<vk::Handle<(vk::HandleType)14>_> local_48;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)context->m_progCollection,&params->binaryName);
  local_58 = *(deUint32 **)(*(long *)(cVar1._M_node + 2) + 8);
  local_78.m_internal._0_4_ = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  DStack_70.m_deviceIface = (DeviceInterface *)0x0;
  DStack_70.m_device = (VkDevice)((ulong)DStack_70.m_device._4_4_ << 0x20);
  DStack_70.m_allocator =
       (VkAllocationCallbacks *)(*(long *)(*(long *)(cVar1._M_node + 2) + 0x10) - (long)local_58);
  if (DStack_70.m_allocator == (VkAllocationCallbacks *)0x0) {
    local_58 = (deUint32 *)0x0;
  }
  ::vk::createShaderModule
            (&local_48,vk,device,(VkShaderModuleCreateInfo *)&local_78,(VkAllocationCallbacks *)0x0)
  ;
  local_78.m_internal._4_4_ =
       local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal._4_4_;
  local_78.m_internal._0_4_ =
       (undefined4)local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  DStack_70.m_deviceIface =
       (DeviceInterface *)
       CONCAT44(local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface
                ._4_4_,local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                       m_deviceIface._0_4_);
  DStack_70.m_device =
       local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  DStack_70.m_allocator =
       local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_70,local_78);
  }
  local_78.m_internal = (deUint64)&DStack_70.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_78.m_internal,
             (undefined1 *)
             ((long)&(DStack_70.m_deviceIface)->_vptr_DeviceInterface + local_78.m_internal));
  if ((VkDevice *)local_78.m_internal != &DStack_70.m_device) {
    operator_delete((void *)local_78.m_internal,(ulong)(DStack_70.m_device + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}